

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void assign_old_filename(filemgr *file,char *old_filename)

{
  size_t sVar1;
  void *pvVar2;
  char *in_RSI;
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x118));
  if (in_RSI == (char *)0x0) {
    *(undefined8 *)(in_RDI + 0x118) = 0;
  }
  else {
    sVar1 = strlen(in_RSI);
    pvVar2 = malloc(sVar1 + 1);
    *(void **)(in_RDI + 0x118) = pvVar2;
    strcpy(*(char **)(in_RDI + 0x118),in_RSI);
  }
  return;
}

Assistant:

static void assign_old_filename(struct filemgr *file, const char *old_filename)
{
    free(file->old_filename);
    if (old_filename) {
        file->old_filename = (char*)malloc(strlen(old_filename) + 1);
        strcpy(file->old_filename, old_filename);
    } else {
        file->old_filename = NULL;
    }
}